

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O3

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  byte bVar1;
  keeponval kVar2;
  Curl_handler *pCVar3;
  ulong uVar4;
  long lVar5;
  dynbuf *pdVar6;
  Curl_chunker *ch;
  _Bool *p_Var7;
  _Bool *p_Var8;
  _Bool _Var9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  h1_tunnel_state_conflict *ts;
  timediff_t tVar13;
  size_t size;
  char *pcVar14;
  size_t sVar15;
  char *auth;
  curl_trc_feat *pcVar16;
  bool bVar17;
  char byte;
  ssize_t nread;
  _Bool local_92;
  char local_91;
  httpreq *local_90;
  h1_tunnel_state_conflict *local_88;
  connectdata *local_80;
  size_t *local_78;
  connectdata **local_70;
  _Bool *local_68;
  curl_off_t *local_60;
  dynbuf *local_58;
  Curl_chunker *local_50;
  char *local_48;
  SingleRequest *local_40;
  size_t local_38;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  ts = (h1_tunnel_state_conflict *)cf->ctx;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 || (0 < pcVar16->log_level))))
     && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"connect");
  }
  CVar10 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar10 != CURLE_OK) {
    return CVar10;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  *done = false;
  if (ts == (h1_tunnel_state_conflict *)0x0) {
    pCVar3 = cf->conn->handler;
    if ((pCVar3->flags & 0x4000) != 0) {
      Curl_failf(data,"%s cannot be done over CONNECT",pCVar3->scheme);
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    ts = (h1_tunnel_state_conflict *)(*Curl_ccalloc)(1,0xb0);
    if (ts == (h1_tunnel_state_conflict *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 || (0 < pcVar16->log_level)))
       ) {
      Curl_infof(data,"allocate connect buffer");
    }
    Curl_dyn_init((dynbuf *)ts,0x4000);
    Curl_dyn_init(&ts->request_data,0x100000);
    Curl_httpchunk_init(data,&ts->ch,true);
    local_70 = &cf->conn;
    Curl_conncontrol(cf->conn,0);
    Curl_dyn_reset((dynbuf *)ts);
    Curl_dyn_reset(&ts->request_data);
    ts->tunnel_state = H1_TUNNEL_INIT;
    ts->keepon = KEEPON_CONNECT;
    ts->cl = 0;
    ts->field_0xac = ts->field_0xac & 0xfd;
    cf->ctx = ts;
  }
  else {
    if (ts->tunnel_state == H1_TUNNEL_ESTABLISHED) goto LAB_00113b6b;
    CVar10 = CURLE_RECV_ERROR;
    if (ts->tunnel_state == H1_TUNNEL_FAILED) goto LAB_00113c74;
    local_70 = &cf->conn;
  }
  local_80 = cf->conn;
  local_58 = &ts->request_data;
  local_78 = &ts->nsent;
  local_60 = &ts->cl;
  local_50 = &ts->ch;
  local_40 = &data->req;
  local_88 = ts;
  do {
    tVar13 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar13 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar10 = CURLE_OPERATION_TIMEDOUT;
LAB_00113c5f:
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_FAILED,data);
      goto LAB_00113c74;
    }
    switch(ts->tunnel_state) {
    case H1_TUNNEL_INIT:
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
           (0 < pcVar16->log_level)))) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"CONNECT start");
      }
      local_90 = (httpreq *)0x0;
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      CVar10 = Curl_http_proxy_create_CONNECT(&local_90,cf,data,1);
      if (CVar10 == CURLE_OK) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
            (0 < pcVar16->log_level)))) {
          Curl_infof(data,"Establish HTTP proxy tunnel to %s",local_90->authority);
        }
        pdVar6 = local_58;
        Curl_dyn_reset(local_58);
        *local_78 = 0;
        local_78[1] = 0;
        CVar10 = Curl_h1_req_write_head
                           (local_90,(uint)(((*local_70)->http_proxy).proxytype != '\x01'),pdVar6);
        if ((CVar10 != CURLE_OK) || (CVar10 = Curl_creader_set_null(data), CVar10 != CURLE_OK))
        goto LAB_001130d6;
        CVar10 = CURLE_OK;
      }
      else {
LAB_001130d6:
        Curl_failf(data,"Failed sending CONNECT to proxy");
      }
      if (local_90 != (httpreq *)0x0) {
        Curl_http_req_free(local_90);
      }
      if (CVar10 != CURLE_OK) goto LAB_00113c5f;
      h1_tunnel_go_state(cf,local_88,H1_TUNNEL_CONNECT,data);
LAB_0011311c:
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         (((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
           (0 < pcVar16->log_level)) && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"CONNECT send");
      }
      break;
    case H1_TUNNEL_CONNECT:
      if (data != (Curl_easy *)0x0) goto LAB_0011311c;
      break;
    case H1_TUNNEL_RECEIVE:
      goto switchD_00112fd8_caseD_2;
    case H1_TUNNEL_RESPONSE:
      goto switchD_00112fd8_caseD_3;
    default:
      goto switchD_00112fd8_default;
    }
    pdVar6 = local_58;
    pcVar14 = Curl_dyn_ptr(local_58);
    sVar15 = Curl_dyn_len(pdVar6);
    local_90 = (httpreq *)((ulong)local_90 & 0xffffffff00000000);
    uVar4 = *local_78;
    if (uVar4 <= sVar15 && sVar15 - uVar4 != 0) {
      size = (*cf->next->cft->do_send)
                       (cf->next,data,pcVar14 + uVar4,sVar15 - uVar4,false,(CURLcode *)&local_90);
      if ((long)size < 0) {
        if ((CURLcode)local_90 == 0x51) goto LAB_001131f2;
      }
      else {
        *local_78 = *local_78 + size;
        Curl_debug(data,CURLINFO_HEADER_OUT,pcVar14 + uVar4,size);
      }
      if ((CURLcode)local_90 != 0) {
        Curl_failf(data,"Failed sending CONNECT to proxy");
        if ((CURLcode)local_90 != CURLE_OK) {
          local_92 = false;
          CVar10 = (CURLcode)local_90;
          goto LAB_00113c5f;
        }
      }
    }
LAB_001131f2:
    ts = local_88;
    if (*local_78 < sVar15) goto LAB_00113b6b;
    h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RECEIVE,data);
switchD_00112fd8_caseD_2:
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 || (0 < pcVar16->log_level))
        )) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"CONNECT receive");
    }
    local_92 = false;
    _Var9 = Curl_conn_data_pending(data,cf->sockindex);
    CVar10 = CURLE_OK;
    if (_Var9) {
      kVar2 = ts->keepon;
      p_Var8 = done;
      p_Var7 = local_68;
      while (local_68 = p_Var8, kVar2 != KEEPON_DONE) {
        CVar10 = Curl_conn_recv(data,cf->sockindex,&local_91,1,(ssize_t *)&local_90);
        if (CVar10 == CURLE_AGAIN) {
          CVar10 = CURLE_OK;
          goto LAB_0011391e;
        }
        iVar11 = Curl_pgrsUpdate(data);
        ch = local_50;
        if (iVar11 != 0) {
          CVar10 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_0011391e;
        }
        if (CVar10 != CURLE_OK) {
          ts->keepon = KEEPON_DONE;
          local_92 = true;
          bVar17 = true;
          goto LAB_00113921;
        }
        if ((long)local_90 < 1) {
          if ((((data->set).proxyauth != 0) && ((data->state).authproxy.avail != 0)) &&
             ((data->state).aptr.proxyuserpwd != (char *)0x0)) {
            ts->field_0xac = ts->field_0xac | 2;
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                (0 < pcVar16->log_level)))) {
              Curl_infof(data,"Proxy CONNECT connection closed");
            }
            goto LAB_001138be;
          }
          Curl_failf(data,"Proxy CONNECT aborted");
          ts->keepon = KEEPON_DONE;
          local_92 = true;
          iVar11 = Curl_pgrsUpdate(data);
          CVar10 = CURLE_ABORTED_BY_CALLBACK;
          if (iVar11 == 0) {
            CVar10 = CURLE_RECV_ERROR;
          }
          goto LAB_00113c5f;
        }
        if (ts->keepon == KEEPON_IGNORE) {
          lVar5 = *local_60;
          if (lVar5 == 0) {
            if ((ts->field_0xac & 1) == 0) goto LAB_00113695;
            local_38 = 0;
            CVar10 = Curl_httpchunk_read(data,local_50,&local_91,1,&local_38);
            if (CVar10 != CURLE_OK) goto LAB_0011391e;
            _Var9 = Curl_httpchunk_is_done(data,ch);
            if (_Var9) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar16->log_level)))) {
                Curl_infof(data,"chunk reading DONE");
              }
              ts->keepon = KEEPON_DONE;
            }
          }
          else {
            *local_60 = lVar5 + -1;
            if (lVar5 < 2) goto LAB_001138be;
          }
        }
        else {
          CVar10 = Curl_dyn_addn(&ts->rcvbuf,&local_91,1);
          if (CVar10 != CURLE_OK) {
            Curl_failf(data,"CONNECT response too large");
            CVar10 = CURLE_RECV_ERROR;
            goto LAB_0011391e;
          }
          if (local_91 == '\n') {
            ts->headerlines = ts->headerlines + 1;
            pcVar14 = Curl_dyn_ptr(&ts->rcvbuf);
            sVar15 = Curl_dyn_len(&ts->rcvbuf);
            Curl_debug(data,CURLINFO_HEADER_IN,pcVar14,sVar15);
            CVar10 = Curl_client_write(data,(uint)(ts->headerlines == 1) * 8 + 0x14,pcVar14,sVar15);
            done = local_68;
            if ((CVar10 != CURLE_OK) ||
               (CVar10 = Curl_bump_headersize(data,sVar15,true), done = local_68, ts = local_88,
               CVar10 != CURLE_OK)) goto LAB_0011391e;
            if ((*pcVar14 == '\r') || (*pcVar14 == '\n')) {
              if (((data->req).httpcode != 0x197) || (((data->state).field_0x744 & 0x20) != 0)) {
LAB_001138be:
                ts->keepon = KEEPON_DONE;
                p_Var7 = local_68;
                break;
              }
              local_88->keepon = KEEPON_IGNORE;
              if (local_88->cl == 0) {
                uVar12 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
                if ((local_88->field_0xac & 1) == 0) {
                  if (((uVar12 >> 0x1c & 1) != 0) &&
                     (((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar16->log_level)) && (0 < cf->cft->log_level)))) {
                    Curl_trc_cf_infof(data,cf,"CONNECT: no content-length or chunked");
                  }
                  goto LAB_001138be;
                }
                if (((uVar12 >> 0x1c & 1) != 0) &&
                   ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar16->log_level)))) {
                  Curl_infof(data,"Ignore chunked response-body");
                }
              }
              else if ((((data->set).field_0x8cd & 0x10) != 0) &&
                      ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                       (0 < pcVar16->log_level)))) {
                Curl_infof(data,"Ignore %ld bytes of response-body");
              }
            }
            else {
              iVar11 = curl_strnequal(pcVar14,"WWW-Authenticate:",0x11);
              if ((iVar11 == 0) || ((data->req).httpcode != 0x191)) {
                iVar11 = curl_strnequal(pcVar14,"Proxy-authenticate:",0x13);
                if ((iVar11 != 0) && (_Var9 = true, (data->req).httpcode == 0x197))
                goto LAB_0011355c;
                iVar11 = curl_strnequal(pcVar14,"Content-Length:",0xf);
                ts = local_88;
                if (iVar11 == 0) {
                  _Var9 = Curl_compareheader(pcVar14,"Connection:",0xb,"close",5);
                  ts = local_88;
                  if (_Var9) {
LAB_0011366a:
                    ts->field_0xac = ts->field_0xac | 2;
                  }
                  else {
                    iVar11 = curl_strnequal(pcVar14,"Transfer-Encoding:",0x12);
                    if (iVar11 == 0) {
                      _Var9 = Curl_compareheader(pcVar14,"Proxy-Connection:",0x11,"close",5);
                      if (_Var9) goto LAB_0011366a;
                      iVar11 = strncmp(pcVar14,"HTTP/1.",7);
                      if (((((iVar11 == 0) && ((pcVar14[7] & 0xfeU) == 0x30)) && (pcVar14[8] == ' ')
                           ) && (((byte)(pcVar14[9] - 0x30U) < 10 &&
                                 (bVar1 = pcVar14[10], (byte)(bVar1 - 0x30) < 10)))) &&
                         (((byte)(pcVar14[0xb] - 0x30U) < 10 && (9 < (byte)(pcVar14[0xc] - 0x30U))))
                         ) {
                        iVar11 = (uint)(byte)pcVar14[9] * 100 + ((uint)bVar1 + (uint)bVar1 * 4) * 2
                                 + (uint)(byte)pcVar14[0xb] + -0x14d0;
                        (data->req).httpcode = iVar11;
                        (data->info).httpproxycode = iVar11;
                      }
                    }
                    else if ((data->req).httpcode - 200U < 100) {
                      if ((((data->set).field_0x8cd & 0x10) != 0) &&
                         ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar16->log_level)))) {
                        pcVar14 = "Ignoring Transfer-Encoding in CONNECT %03d response";
                        goto LAB_00113637;
                      }
                    }
                    else {
                      _Var9 = Curl_compareheader(pcVar14,"Transfer-Encoding:",0x12,"chunked",7);
                      if (_Var9) {
                        if ((((data->set).field_0x8cd & 0x10) != 0) &&
                           ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                            (0 < pcVar16->log_level)))) {
                          Curl_infof(data,"CONNECT responded chunked");
                        }
                        ts->field_0xac = ts->field_0xac | 1;
                        Curl_httpchunk_reset(data,local_50,true);
                      }
                    }
                  }
                }
                else if ((data->req).httpcode - 200U < 100) {
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar16->log_level)))) {
                    pcVar14 = "Ignoring Content-Length in CONNECT %03d response";
LAB_00113637:
                    Curl_infof(data,pcVar14);
                  }
                }
                else {
                  curlx_strtoofft(pcVar14 + 0xf,(char **)0x0,10,local_60);
                }
              }
              else {
                _Var9 = false;
LAB_0011355c:
                auth = Curl_copy_header_value(pcVar14);
                if (auth == (char *)0x0) {
                  CVar10 = CURLE_OUT_OF_MEMORY;
                  goto LAB_0011391e;
                }
                if ((((data->set).field_0x8cd & 0x10) != 0) &&
                   (((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar16->log_level)) && (0 < cf->cft->log_level)))) {
                  local_48 = auth;
                  Curl_trc_cf_infof(data,cf,"CONNECT: fwd auth header \'%s\'",pcVar14);
                  auth = local_48;
                }
                CVar10 = Curl_http_input_auth(data,_Var9,auth);
                (*Curl_cfree)(auth);
                ts = local_88;
                if (CVar10 != CURLE_OK) goto LAB_0011391e;
              }
              Curl_dyn_reset(&ts->rcvbuf);
            }
          }
        }
LAB_00113695:
        p_Var8 = local_68;
        p_Var7 = local_68;
        kVar2 = ts->keepon;
      }
      local_68 = p_Var7;
      local_92 = true;
      bVar17 = true;
      if ((data->info).httpproxycode - 200U < 100) {
        CVar10 = CURLE_OK;
      }
      else {
        CVar10 = Curl_http_auth_act(data);
      }
    }
    else {
LAB_0011391e:
      bVar17 = false;
    }
LAB_00113921:
    iVar11 = Curl_pgrsUpdate(data);
    ts = local_88;
    if (iVar11 != 0) {
      CVar10 = CURLE_ABORTED_BY_CALLBACK;
      goto LAB_00113c5f;
    }
    if (CVar10 != CURLE_OK) goto LAB_00113c5f;
    if (!bVar17) goto LAB_00113b6b;
    h1_tunnel_go_state(cf,local_88,H1_TUNNEL_RESPONSE,data);
switchD_00112fd8_caseD_3:
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       (((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 || (0 < pcVar16->log_level))
        && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"CONNECT response");
    }
    if ((data->req).newurl == (char *)0x0) break;
    Curl_req_soft_reset(local_40,data);
    if (((ts->field_0xac & 2) != 0) || (((ulong)local_80->bits & 0x20) != 0)) {
      if (((data->set).field_0x8cd & 0x10) != 0) {
        pcVar16 = (data->state).feat;
        if ((pcVar16 == (curl_trc_feat *)0x0) || (0 < pcVar16->log_level)) {
          if (0 < cf->cft->log_level) {
            Curl_trc_cf_infof(data,cf,"CONNECT need to close+open");
            if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_00113b37;
            pcVar16 = (data->state).feat;
          }
          if (pcVar16 != (curl_trc_feat *)0x0) goto LAB_00113b20;
        }
        else {
LAB_00113b20:
          if (pcVar16->log_level < 1) goto LAB_00113b37;
        }
        Curl_infof(data,"Connect me again please");
      }
LAB_00113b37:
      Curl_conn_cf_close(cf,data);
      Curl_conncontrol(local_80,0);
      CVar10 = Curl_conn_cf_connect(cf->next,data,false,&local_92);
      if (CVar10 != CURLE_OK) goto LAB_00113c5f;
      goto LAB_00113b6b;
    }
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_INIT,data);
switchD_00112fd8_default:
  } while ((data->req).newurl != (char *)0x0);
  if (99 < (data->info).httpproxycode - 200U) {
    (*Curl_cfree)((void *)0x0);
    (data->req).newurl = (char *)0x0;
    Curl_conncontrol(local_80,2);
    h1_tunnel_go_state(cf,ts,H1_TUNNEL_FAILED,data);
    Curl_failf(data,"CONNECT tunnel failed, response %d",(ulong)(uint)(data->req).httpcode);
    CVar10 = CURLE_RECV_ERROR;
LAB_00113c74:
    *done = false;
    return CVar10;
  }
  h1_tunnel_go_state(cf,ts,H1_TUNNEL_ESTABLISHED,data);
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar16 = (data->state).feat, pcVar16 == (curl_trc_feat *)0x0 || (0 < pcVar16->log_level))))
  {
    Curl_infof(data,"CONNECT tunnel established, response %d",
               (ulong)(uint)(data->info).httpproxycode);
  }
LAB_00113b6b:
  (*Curl_cfree)((data->state).aptr.proxyuserpwd);
  (data->state).aptr.proxyuserpwd = (char *)0x0;
  if (cf->ctx == (void *)0x0) {
    *done = false;
  }
  else {
    bVar17 = *(int *)((long)cf->ctx + 0xa8) == 4;
    *done = bVar17;
    if (bVar17) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_req_soft_reset(&data->req,data);
      Curl_client_reset(data);
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      tunnel_free(cf,data);
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* TODO: can we do blocking? */
  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* The real request will follow the CONNECT, reset request partially */
    Curl_req_soft_reset(&data->req, data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}